

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint64_t absl::lts_20250127::hash_internal::HashLen0to16(char *s,size_t len)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t val;
  uint64_t uVar5;
  uint64_t uVar6;
  uint32_t z;
  uint32_t y;
  uint8_t c_1;
  uint8_t b_1;
  uint8_t a_2;
  uint64_t a_1;
  uint64_t mul_1;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t mul;
  size_t len_local;
  char *s_local;
  
  if (len < 8) {
    if (len < 4) {
      if (len == 0) {
        s_local = (char *)0x9ae16a3b2f90404f;
      }
      else {
        uVar3 = ShiftMix((ulong)((uint)(byte)*s + (uint)(byte)s[len >> 1] * 0x100) *
                         -0x651e95c4d06fbfb1 ^
                         (ulong)((int)len + (uint)(byte)s[len - 1] * 4) * -0x3c5a37a36834ced9);
        s_local = (char *)(uVar3 * -0x651e95c4d06fbfb1);
      }
    }
    else {
      uVar1 = Fetch32(s);
      uVar2 = Fetch32(s + (len - 4));
      s_local = (char *)HashLen16(len + (ulong)uVar1 * 8,(ulong)uVar2,len * 2 + 0x9ae16a3b2f90404f);
    }
  }
  else {
    uVar3 = len * 2 + 0x9ae16a3b2f90404f;
    uVar4 = Fetch64(s);
    val = Fetch64(s + (len - 8));
    uVar5 = Rotate(val,0x25);
    uVar6 = Rotate(uVar4 + 0x9ae16a3b2f90404f,0x19);
    s_local = (char *)HashLen16(uVar5 * uVar3 + uVar4 + 0x9ae16a3b2f90404f,(uVar6 + val) * uVar3,
                                uVar3);
  }
  return (uint64_t)s_local;
}

Assistant:

static uint64_t HashLen0to16(const char *s, size_t len) {
  if (len >= 8) {
    uint64_t mul = k2 + len * 2;
    uint64_t a = Fetch64(s) + k2;
    uint64_t b = Fetch64(s + len - 8);
    uint64_t c = Rotate(b, 37) * mul + a;
    uint64_t d = (Rotate(a, 25) + b) * mul;
    return HashLen16(c, d, mul);
  }
  if (len >= 4) {
    uint64_t mul = k2 + len * 2;
    uint64_t a = Fetch32(s);
    return HashLen16(len + (a << 3), Fetch32(s + len - 4), mul);
  }
  if (len > 0) {
    uint8_t a = static_cast<uint8_t>(s[0]);
    uint8_t b = static_cast<uint8_t>(s[len >> 1]);
    uint8_t c = static_cast<uint8_t>(s[len - 1]);
    uint32_t y = static_cast<uint32_t>(a) + (static_cast<uint32_t>(b) << 8);
    uint32_t z = static_cast<uint32_t>(len) + (static_cast<uint32_t>(c) << 2);
    return ShiftMix(y * k2 ^ z * k0) * k2;
  }
  return k2;
}